

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O3

void __thiscall DSectorEffect::Destroy(DSectorEffect *this)

{
  sector_t_conflict *psVar1;
  DSectorEffect *pDVar2;
  DThinker *pDVar3;
  DThinker *pDVar4;
  
  psVar1 = this->m_Sector;
  if (psVar1 != (sector_t_conflict *)0x0) {
    pDVar2 = (psVar1->floordata).field_0.p;
    if ((pDVar2 != (DSectorEffect *)0x0) &&
       (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 || pDVar2 == this)) {
      (psVar1->floordata).field_0.p = (DSectorEffect *)0x0;
    }
    pDVar2 = (this->m_Sector->ceilingdata).field_0.p;
    if ((pDVar2 != (DSectorEffect *)0x0) &&
       (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 || pDVar2 == this)) {
      (this->m_Sector->ceilingdata).field_0.p = (DSectorEffect *)0x0;
    }
    pDVar2 = (this->m_Sector->lightingdata).field_0.p;
    if ((pDVar2 != (DSectorEffect *)0x0) &&
       (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 || pDVar2 == this)) {
      (this->m_Sector->lightingdata).field_0.p = (DSectorEffect *)0x0;
      DThinker::Destroy(&this->super_DThinker);
      return;
    }
  }
  pDVar3 = (this->super_DThinker).NextThinker;
  pDVar4 = (this->super_DThinker).PrevThinker;
  if (pDVar4 == (DThinker *)0x0 || pDVar3 == (DThinker *)0x0) {
    if (pDVar3 != (DThinker *)0x0 || pDVar4 != (DThinker *)0x0) {
      __assert_fail("(NextThinker != NULL && PrevThinker != NULL) || (NextThinker == NULL && PrevThinker == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                    ,0x103,"virtual void DThinker::Destroy()");
    }
  }
  else {
    DThinker::Remove(&this->super_DThinker);
  }
  DObject::Destroy((DObject *)this);
  return;
}

Assistant:

void DSectorEffect::Destroy()
{
	if (m_Sector)
	{
		if (m_Sector->floordata == this)
		{
			m_Sector->floordata = NULL;
		}
		if (m_Sector->ceilingdata == this)
		{
			m_Sector->ceilingdata = NULL;
		}
		if (m_Sector->lightingdata == this)
		{
			m_Sector->lightingdata = NULL;
		}
	}
	Super::Destroy();
}